

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O1

int dlep_writer_add_ip_tlv(dlep_writer *writer,netaddr *ip,_Bool add)

{
  uint16_t len;
  uint16_t type;
  uint8_t value [18];
  undefined1 local_28;
  undefined1 local_27 [4];
  uint8_t local_23;
  uint8_t local_17;
  
  local_28 = add;
  netaddr_to_binary(local_27,ip,0x10);
  if (ip->_type == '\n') {
    local_17 = ip->_prefix_len;
    if (local_17 == 0x80) {
      type = 9;
      len = 0x11;
    }
    else {
      type = 0xb;
      len = 0x12;
    }
  }
  else {
    if (ip->_type != '\x02') {
      return -1;
    }
    local_23 = ip->_prefix_len;
    if (local_23 == ' ') {
      type = 8;
      len = 5;
    }
    else {
      type = 10;
      len = 6;
    }
  }
  dlep_writer_add_tlv(writer,type,&local_28,len);
  return 0;
}

Assistant:

int
dlep_writer_add_ip_tlv(struct dlep_writer *writer, const struct netaddr *ip, bool add) {
  uint8_t value[18];

  value[0] = add ? DLEP_IP_ADD : DLEP_IP_REMOVE;
  netaddr_to_binary(&value[1], ip, 16);

  switch (netaddr_get_address_family(ip)) {
    case AF_INET:
      value[5] = netaddr_get_prefix_length(ip);
      if (value[5] != 32) {
        dlep_writer_add_tlv(writer, DLEP_IPV4_SUBNET_TLV, value, 6);
      }
      else {
        dlep_writer_add_tlv(writer, DLEP_IPV4_ADDRESS_TLV, value, 5);
      }
      break;
    case AF_INET6:
      value[17] = netaddr_get_prefix_length(ip);
      if (value[17] != 128) {
        dlep_writer_add_tlv(writer, DLEP_IPV6_SUBNET_TLV, value, 18);
      }
      else {
        dlep_writer_add_tlv(writer, DLEP_IPV6_ADDRESS_TLV, value, 17);
      }
      break;
    default:
      return -1;
  }
  return 0;
}